

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O0

void __thiscall hwtest::pgraph::MthdCelsiusTexGenMode::emulate_mthd(MthdCelsiusTexGenMode *this)

{
  uint32_t uVar1;
  char cVar2;
  char cVar3;
  uint local_18;
  uint local_14;
  uint32_t rv;
  uint32_t err;
  MthdCelsiusTexGenMode *this_local;
  
  local_14 = 0;
  if ((long)((ulong)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_config_c
            << 0x37) < 0) {
    local_14 = 4;
  }
  local_18 = 0;
  uVar1 = (this->super_SingleMthdTest).super_MthdTest.val;
  if (uVar1 == 0) {
    local_18 = 0;
    goto LAB_00260112;
  }
  if (uVar1 == 0x2400) {
    local_18 = 1;
    goto LAB_00260112;
  }
  if (uVar1 == 0x2401) {
    local_18 = 2;
    goto LAB_00260112;
  }
  if (uVar1 == 0x2402) {
LAB_002600f1:
    if (this->which < 2) {
      local_18 = 3;
      goto LAB_00260112;
    }
  }
  else {
    if (uVar1 == 0x8511) {
      if (this->which < 3) {
        local_18 = 4;
        goto LAB_00260112;
      }
LAB_002600c1:
      if (this->which < 3) {
        local_18 = 5;
        goto LAB_00260112;
      }
LAB_002600d9:
      if (this->which < 3) {
        local_18 = 6;
        goto LAB_00260112;
      }
      goto LAB_002600f1;
    }
    if (uVar1 == 0x8512) goto LAB_002600c1;
    if (uVar1 == 0x855f) goto LAB_002600d9;
  }
  local_14 = local_14 | 1;
LAB_00260112:
  if (local_14 == 0) {
    if (-1 < (long)((ulong)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource
                   << 0x3e)) {
      cVar2 = '\x03';
      if (this->which == 3) {
        cVar2 = '\x02';
      }
      cVar3 = '\x03';
      if (this->which == 3) {
        cVar3 = '\x02';
      }
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_b =
           (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_b &
           ((uint)((2L << (cVar2 - 1U & 0x3f)) + -1 <<
                  ((char)*(undefined4 *)&(this->super_SingleMthdTest).super_MthdTest.field_0x25914 *
                   '\x0e' + '\x03' + (char)this->which * '\x03' & 0x3fU)) ^ 0xffffffff) |
           (uint)(((ulong)local_18 & (2L << (cVar3 - 1U & 0x3f)) - 1U) <<
                 ((char)*(undefined4 *)&(this->super_SingleMthdTest).super_MthdTest.field_0x25914 *
                  '\x0e' + '\x03' + (char)this->which * '\x03' & 0x3fU));
      if (-1 < (long)((ulong)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.debug_d
                     << 0x23)) {
        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_junk[2] =
             (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_a;
        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_junk[3] =
             (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_b;
      }
    }
  }
  else {
    MthdTest::warn((MthdTest *)this,local_14);
  }
  return;
}

Assistant:

void emulate_mthd() override {
		uint32_t err = 0;
		if (extr(exp.celsius_config_c, 8, 1))
			err |= 4;
		uint32_t rv = 0;
		switch (val) {
			case 0:
				rv = 0;
				break;
			case 0x2400:
				rv = 1;
				break;
			case 0x2401:
				rv = 2;
				break;
			case 0x8511:
				if (which < 3) {
					rv = 4;
					break;
				}
			case 0x8512:
				if (which < 3) {
					rv = 5;
					break;
				}
			case 0x855f:
				if (which < 3) {
					rv = 6;
					break;
				}
			case 0x2402:
				if (which < 2) {
					rv = 3;
					break;
				}
			default:
				err |= 1;
		}
		if (err) {
			warn(err);
		} else {
			if (!extr(exp.nsource, 1, 1)) {
				insrt(exp.celsius_xf_misc_b, 3 + idx * 14 + which * 3, which == 3 ? 2 : 3, rv);
				if (!extr(exp.debug_d, 28, 1)) {
					exp.celsius_pipe_junk[2] = exp.celsius_xf_misc_a;
					exp.celsius_pipe_junk[3] = exp.celsius_xf_misc_b;
				}
			}
		}
	}